

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O2

void obx::internal::throwIllegalArgumentException(char *text1,char *text2)

{
  IllegalArgumentException *this;
  allocator local_31;
  string msg;
  
  std::__cxx11::string::string((string *)&msg,text1,&local_31);
  if (text2 != (char *)0x0) {
    std::__cxx11::string::append((char *)&msg);
  }
  this = (IllegalArgumentException *)__cxa_allocate_exception(0x10);
  IllegalArgumentException::runtime_error(this,&msg);
  __cxa_throw(this,&IllegalArgumentException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

[[noreturn]] void throwIllegalArgumentException(const char* text1, const char* text2) {
    std::string msg(text1);
    if (text2) msg.append(text2);
    throw IllegalArgumentException(msg);
}